

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O0

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>>::
construct<tchecker::clockval_t_const&>
          (pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>> *this,
          clockval_t *args)

{
  void *pvVar1;
  clockval_t *in_RDX;
  void *p;
  void *t;
  clockval_t *args_local;
  pool_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_> *this_local;
  
  pvVar1 = pool_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::allocate
                     ((pool_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_> *)
                      args);
  if (pvVar1 == (void *)0x0) {
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
    intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
                *)this,(make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)0x0);
  }
  else {
    make_shared_t<tchecker::clockval_t,unsigned_long,1ul>::construct<tchecker::clockval_t_const&>
              ((make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)((long)pvVar1 + 8),in_RDX)
    ;
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
    intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
                *)this,(make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)((long)pvVar1 + 8)
              );
  }
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
         )(make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }